

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O3

void Dump(OutputStream *stream,SQFunctionProto *func,bool deep)

{
  undefined7 in_register_00000011;
  char *pcVar1;
  SQInt32 in_R8D;
  ulong uVar2;
  long lVar3;
  
  if (((int)CONCAT71(in_register_00000011,deep) != 0) && (func->_nfunctions != 0)) {
    lVar3 = 8;
    uVar2 = 0;
    do {
      Dump(stream,*(SQFunctionProto **)((long)&(func->_functions->super_SQObject)._type + lVar3),
           true);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < (ulong)func->_nfunctions);
  }
  streamprintf(stream,"SQInstruction sizeof %d\n",8);
  streamprintf(stream,"SQObject sizeof %d\n",0x10);
  streamprintf(stream,"--------------------------------------------------------------------\n");
  if ((func->_name).super_SQObject._type == OT_STRING) {
    pcVar1 = (char *)&((func->_name).super_SQObject._unVal.pTable)->_firstfree;
  }
  else {
    pcVar1 = "unknown";
  }
  streamprintf(stream,"*****FUNCTION [%s]\n",pcVar1);
  DumpLiterals(stream,func->_literals,(SQInt32)func->_nliterals);
  streamprintf(stream,"-----PARAMS\n");
  if (func->_varparams != 0) {
    streamprintf(stream,"<<VARPARAMS>>\n");
  }
  if (func->_nparameters != 0) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      streamprintf(stream,"[%d] ",uVar2 & 0xffffffff);
      DumpLiteral(stream,(SQObjectPtr *)((long)&(func->_parameters->super_SQObject)._type + lVar3));
      streamprintf(stream,"\n");
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < (ulong)func->_nparameters);
  }
  DumpLocals(stream,func->_localvarinfos,(SQInt32)func->_nlocalvarinfos);
  DumpLineInfo(stream,func->_lineinfos,(SQInt32)func->_nlineinfos);
  streamprintf(stream,"-----dump\n");
  DumpInstructions(stream,func->_instructions,(SQInt32)func->_ninstructions,func->_literals,in_R8D);
  streamprintf(stream,"-----\n");
  streamprintf(stream,"stack size[%d]\n",(ulong)(uint)func->_stacksize);
  streamprintf(stream,"--------------------------------------------------------------------\n\n");
  return;
}

Assistant:

void Dump(OutputStream *stream, SQFunctionProto *func, bool deep)
{

    //if (!dump_enable) return ;
    SQUnsignedInteger n = 0, i;
    SQInteger si;
    if (deep) {
        for (i = 0; i < func->_nfunctions; ++i) {
            SQObjectPtr &f = func->_functions[i];
            assert(sq_isfunction(f));
            Dump(stream, _funcproto(f), deep);
        }
    }
    streamprintf(stream, _SC("SQInstruction sizeof %d\n"), (SQInt32)sizeof(SQInstruction));
    streamprintf(stream, _SC("SQObject sizeof %d\n"), (SQInt32)sizeof(SQObject));
    streamprintf(stream, _SC("--------------------------------------------------------------------\n"));
    streamprintf(stream, _SC("*****FUNCTION [%s]\n"), sq_type(func->_name) == OT_STRING ? _stringval(func->_name) : _SC("unknown"));
    DumpLiterals(stream, func->_literals, func->_nliterals);
    streamprintf(stream, _SC("-----PARAMS\n"));
    if (func->_varparams)
        streamprintf(stream, _SC("<<VARPARAMS>>\n"));
    n = 0;
    for (i = 0; i < func->_nparameters; i++) {
        streamprintf(stream, _SC("[%d] "), (SQInt32)n);
        DumpLiteral(stream, func->_parameters[i]);
        streamprintf(stream, _SC("\n"));
        n++;
    }
    DumpLocals(stream, func->_localvarinfos, func->_nlocalvarinfos);
    DumpLineInfo(stream, func->_lineinfos, func->_nlineinfos);
    streamprintf(stream, _SC("-----dump\n"));
    DumpInstructions(stream, func->_instructions, func->_ninstructions, func->_literals, func->_nliterals);
    streamprintf(stream, _SC("-----\n"));
    streamprintf(stream, _SC("stack size[%d]\n"), (SQInt32)func->_stacksize);
    streamprintf(stream, _SC("--------------------------------------------------------------------\n\n"));
}